

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.c
# Opt level: O3

void connection_on_bytes_received(void *context,uchar *buffer,size_t size)

{
  uint uVar1;
  int iVar2;
  LOGGER_LOG p_Var3;
  long lVar4;
  size_t sVar5;
  uchar local_31;
  
  if (size != 0) {
    sVar5 = 0;
    do {
      local_31 = buffer[sVar5];
      uVar1 = *(uint *)((long)context + 0x10);
      if (9 < uVar1) {
LAB_0010f2a0:
        p_Var3 = xlogging_get_log_function();
        if (p_Var3 != (LOGGER_LOG)0x0) {
          (*p_Var3)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/connection.c"
                    ,"connection_byte_received",0x27d,1,"Unknown connection state: %d",
                    *(undefined4 *)((long)context + 0x10));
        }
LAB_0010f2da:
        p_Var3 = xlogging_get_log_function();
        if (p_Var3 == (LOGGER_LOG)0x0) {
          return;
        }
        (*p_Var3)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/connection.c"
                  ,"connection_on_bytes_received",0x2d3,1,"Cannot process received bytes");
        return;
      }
      if ((0x2caU >> (uVar1 & 0x1f) & 1) == 0) {
        if ((5U >> (uVar1 & 0x1f) & 1) == 0) goto LAB_0010f2a0;
        if ("AMQP"[*(long *)((long)context + 8)] != local_31) {
          iVar2 = xio_close(*context,(ON_IO_CLOSE_COMPLETE)0x0,(void *)0x0);
          if ((iVar2 != 0) && (p_Var3 = xlogging_get_log_function(), p_Var3 != (LOGGER_LOG)0x0)) {
            (*p_Var3)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/connection.c"
                      ,"connection_byte_received",0x28b,1,"xio_close failed");
          }
          connection_set_state((CONNECTION_HANDLE)context,CONNECTION_STATE_END);
          goto LAB_0010f2da;
        }
        lVar4 = *(long *)((long)context + 8) + 1;
        *(long *)((long)context + 8) = lVar4;
        if (lVar4 == 8) {
          if (((*(byte *)((long)context + 0xe0) & 8) != 0) &&
             (p_Var3 = xlogging_get_log_function(), p_Var3 != (LOGGER_LOG)0x0)) {
            (*p_Var3)(AZ_LOG_TRACE,
                      "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/connection.c"
                      ,"connection_byte_received",0x298,1,"<- Header (AMQP 0.1.0.0)");
          }
          connection_set_state((CONNECTION_HANDLE)context,CONNECTION_STATE_HDR_EXCH);
          iVar2 = send_open_frame((CONNECTION_HANDLE)context);
          if (iVar2 != 0) {
            p_Var3 = xlogging_get_log_function();
            if (p_Var3 != (LOGGER_LOG)0x0) {
              (*p_Var3)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/connection.c"
                        ,"connection_byte_received",0x29f,1,"Cannot send open frame");
            }
            connection_set_state((CONNECTION_HANDLE)context,CONNECTION_STATE_END);
          }
        }
      }
      else {
        iVar2 = frame_codec_receive_bytes(*(FRAME_CODEC_HANDLE *)((long)context + 0x18),&local_31,1)
        ;
        if (iVar2 != 0) {
          p_Var3 = xlogging_get_log_function();
          if (p_Var3 != (LOGGER_LOG)0x0) {
            (*p_Var3)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/connection.c"
                      ,"connection_byte_received",0x2ba,1,"Cannot process received bytes");
          }
          close_connection_with_error
                    ((CONNECTION_HANDLE)context,"amqp:internal-error",
                     "connection_byte_received::frame_codec_receive_bytes failed",(AMQP_VALUE)0x0);
          goto LAB_0010f2da;
        }
      }
      sVar5 = sVar5 + 1;
    } while (size != sVar5);
  }
  return;
}

Assistant:

static void connection_on_bytes_received(void* context, const unsigned char* buffer, size_t size)
{
    size_t i;

    for (i = 0; i < size; i++)
    {
        if (connection_byte_received((CONNECTION_HANDLE)context, buffer[i]) != 0)
        {
            LogError("Cannot process received bytes");
            break;
        }
    }
}